

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O0

void __thiscall
PolicyPureVector::PolicyPureVector
          (PolicyPureVector *this,I_PtPD_constPtr *pu,Index agentI,PolicyDomainCategory idc,
          size_t depth)

{
  PolicyDomainCategory PVar1;
  Interface_ProblemToPolicyDiscretePure *pIVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint in_EDX;
  PolicyDiscrete *in_RDI;
  undefined8 in_R8;
  Index nrDE;
  undefined8 in_stack_ffffffffffffff70;
  I_PtPD_constPtr *in_stack_ffffffffffffff78;
  allocator_type *__a;
  PolicyDiscretePure *in_stack_ffffffffffffff80;
  uint uVar3;
  PolicyDiscrete *this_01;
  allocator_type local_55;
  undefined4 local_54;
  int local_24;
  undefined8 local_20;
  uint local_14;
  undefined4 extraout_var;
  
  local_20 = in_R8;
  local_14 = in_EDX;
  PolicyDiscretePure::PolicyDiscretePure
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (PolicyDomainCategory)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             (Index)in_stack_ffffffffffffff70);
  (in_RDI->super_Policy)._vptr_Policy = (_func_int **)&PTR__PolicyPureVector_00d142f0;
  this_01 = in_RDI + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x984033);
  pIVar2 = PolicyDiscretePure::GetInterfacePTPDiscretePure(in_stack_ffffffffffffff80);
  uVar3 = local_14;
  PVar1 = PolicyDiscrete::GetPolicyDomainCategory(in_RDI);
  local_24 = (*(pIVar2->super_Interface_ProblemToPolicyDiscrete).
               _vptr_Interface_ProblemToPolicyDiscrete[5])
                       (pIVar2,(ulong)uVar3,(ulong)PVar1,local_20);
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(extraout_var,local_24);
  *(uint *)&in_RDI->field_0x34 = local_14;
  local_54 = 0;
  __a = &local_55;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9840b9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,CONCAT44(PVar1,uVar3),
             (value_type_conflict1 *)this_00,__a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9840fb);
  return;
}

Assistant:

PolicyPureVector::PolicyPureVector(
    const I_PtPD_constPtr &pu,
    Index agentI,
    PolicyGlobals::PolicyDomainCategory idc,
    size_t depth
        ) :
     PolicyDiscretePure(pu,idc, agentI)
{
    Index nrDE = GetInterfacePTPDiscretePure()->
        GetNrPolicyDomainElements(agentI, GetPolicyDomainCategory(), depth);
    if(DEBUG_PPV)
        cout << "PolicyPureVector(): creating policy for agent "<<agentI
             << ", depth " << depth << " (nr domain elements "
             << nrDE << ")" << endl;

    _m_agentI = agentI;
    _m_domainToActionIndices = vector<Index>(nrDE, 0);
}